

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

PList * p_ini_file_keys(PIniFile *file,pchar *section)

{
  int iVar1;
  pchar *data;
  bool bVar2;
  PList *local_30;
  PList *item;
  PList *ret;
  pchar *section_local;
  PIniFile *file_local;
  
  bVar2 = true;
  if ((file != (PIniFile *)0x0) && (bVar2 = true, file->is_parsed != 0)) {
    bVar2 = section == (pchar *)0x0;
  }
  if (bVar2) {
    file_local = (PIniFile *)0x0;
  }
  else {
    item = (PList *)0x0;
    local_30 = file->sections;
    while ((local_30 != (PList *)0x0 && (iVar1 = strcmp(*local_30->data,section), iVar1 != 0))) {
      local_30 = local_30->next;
    }
    if (local_30 == (PList *)0x0) {
      file_local = (PIniFile *)0x0;
    }
    else {
      for (local_30 = *(PList **)((long)local_30->data + 8); local_30 != (PList *)0x0;
          local_30 = *(PList **)((long)local_30 + 8)) {
        data = p_strdup((pchar *)**(undefined8 **)local_30);
        item = p_list_prepend(item,data);
      }
      file_local = (PIniFile *)item;
    }
  }
  return (PList *)file_local;
}

Assistant:

P_LIB_API PList *
p_ini_file_keys (const PIniFile	*file,
		 const pchar	*section)
{
	PList	*ret;
	PList	*item;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE || section == NULL))
		return NULL;

	ret = NULL;

	for (item = file->sections; item != NULL; item = item->next)
		if (strcmp (((PIniSection *) item->data)->name, section) == 0)
			break;

	if (item == NULL)
		return NULL;

	for (item = ((PIniSection *) item->data)->keys; item != NULL; item = item->next)
		ret = p_list_prepend (ret, p_strdup (((PIniParameter *) item->data)->name));

	return ret;
}